

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O0

void __thiscall cppcms::impl::cgi::http::~http(http *this)

{
  int iVar1;
  undefined8 *in_RDI;
  error_code e;
  connection *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  *in_RDI = &PTR__http_00530c38;
  iVar1 = booster::aio::basic_io_device::native();
  if (iVar1 != -1) {
    in_stack_ffffffffffffffd0 = (connection *)&stack0xffffffffffffffe8;
    std::error_code::error_code((error_code *)in_stack_ffffffffffffffd0);
    booster::aio::stream_socket::shutdown(in_RDI + 0x20,2,in_stack_ffffffffffffffd0);
  }
  std::__cxx11::string::~string((string *)(in_RDI + 0x5c));
  std::__cxx11::string::~string((string *)(in_RDI + 0x58));
  std::shared_ptr<cppcms::impl::url_rewriter>::~shared_ptr
            ((shared_ptr<cppcms::impl::url_rewriter> *)0x4982dd);
  std::shared_ptr<cppcms::impl::cgi::http_watchdog>::~shared_ptr
            ((shared_ptr<cppcms::impl::cgi::http_watchdog> *)0x4982ee);
  std::__cxx11::string::~string((string *)(in_RDI + 0x50));
  std::__cxx11::string::~string((string *)(in_RDI + 0x3e));
  cppcms::http::impl::parser::~parser((parser *)in_stack_ffffffffffffffd0);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
  booster::aio::stream_socket::~stream_socket((stream_socket *)(in_RDI + 0x20));
  connection::~connection(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

~http()
		{
			if(socket_.native()!=io::invalid_socket) {
				booster::system::error_code e;
				socket_.shutdown(io::stream_socket::shut_rdwr,e);
			}
		}